

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O2

bool __thiscall QWidgetAction::event(QWidgetAction *this,QEvent *event)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  undefined1 uVar4;
  int i;
  ulong uVar5;
  QWidget *pQVar6;
  
  if (*(short *)(event + 8) == 0x71) {
    lVar1 = *(long *)&this->field_0x8;
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x1a8));
    if (bVar3) {
      lVar2 = *(long *)(lVar1 + 0x1a8);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        pQVar6 = (QWidget *)0x0;
      }
      else {
        pQVar6 = *(QWidget **)(lVar1 + 0x1b0);
      }
      bVar3 = (bool)QAction::isEnabled();
      QWidget::setEnabled(pQVar6,bVar3);
    }
    for (uVar5 = 0; uVar5 < *(ulong *)(lVar1 + 0x1c8); uVar5 = uVar5 + 1) {
      pQVar6 = *(QWidget **)(*(long *)(lVar1 + 0x1c0) + uVar5 * 8);
      bVar3 = (bool)QAction::isEnabled();
      QWidget::setEnabled(pQVar6,bVar3);
    }
  }
  uVar4 = QAction::event((QEvent *)this);
  return (bool)uVar4;
}

Assistant:

bool QWidgetAction::event(QEvent *event)
{
    Q_D(QWidgetAction);
    if (event->type() == QEvent::ActionChanged) {
        if (d->defaultWidget)
            d->defaultWidget->setEnabled(isEnabled());
        for (int i = 0; i < d->createdWidgets.size(); ++i)
            d->createdWidgets.at(i)->setEnabled(isEnabled());
    }
    return QAction::event(event);
}